

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,bool deterministic,uint8 *target)

{
  double dVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  bool bVar5;
  Type *this_00;
  uint8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int index;
  byte *pbVar11;
  
  iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                          (&(this->name_).super_RepeatedPtrFieldBase,index);
      *target = 0x12;
      pbVar11 = target + 1;
      uVar10 = this_00->_cached_size_;
      uVar7 = uVar10;
      if (0x7f < uVar10) {
        do {
          *pbVar11 = (byte)uVar10 | 0x80;
          uVar7 = uVar10 >> 7;
          pbVar11 = pbVar11 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar7;
        } while (bVar5);
      }
      *pbVar11 = (byte)uVar7;
      target = UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar11 + 1);
      index = index + 1;
    } while (index != iVar2);
  }
  uVar10 = (this->_has_bits_).has_bits_[0];
  if ((uVar10 & 1) != 0) {
    psVar3 = (this->identifier_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.identifier_value");
    psVar3 = (this->identifier_value_).ptr_;
    *target = 0x1a;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar10 & 8) != 0) {
    uVar9 = this->positive_int_value_;
    *target = 0x20;
    pbVar11 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar9 | 0x80;
        uVar8 = uVar9 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar8;
      } while (bVar5);
    }
    *pbVar11 = (byte)uVar8;
    target = pbVar11 + 1;
  }
  if ((uVar10 & 0x10) != 0) {
    uVar9 = this->negative_int_value_;
    *target = 0x28;
    pbVar11 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar11 = (byte)uVar9 | 0x80;
        uVar8 = uVar9 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar8;
      } while (bVar5);
    }
    *pbVar11 = (byte)uVar8;
    target = pbVar11 + 1;
  }
  if ((uVar10 & 0x20) != 0) {
    dVar1 = this->double_value_;
    *target = 0x31;
    *(double *)(target + 1) = dVar1;
    target = target + 9;
  }
  if ((uVar10 & 2) != 0) {
    psVar3 = (this->string_value_).ptr_;
    *target = 0x3a;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  if ((uVar10 & 4) != 0) {
    psVar3 = (this->aggregate_value_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.UninterpretedOption.aggregate_value");
    psVar3 = (this->aggregate_value_).ptr_;
    *target = 0x42;
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar3,target + 1);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
    return puVar6;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0, n = this->name_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, this->name(i), deterministic, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4, this->positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(5, this->negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteDoubleToArray(6, this->double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        7, this->string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->aggregate_value(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}